

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CustomComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  int damage;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  AActor *pAVar6;
  AActor *self;
  int iVar7;
  char *pcVar8;
  int iVar9;
  PClassActor *type;
  DAngle angle;
  double dVar10;
  FName local_58;
  FSoundID local_54;
  undefined8 local_50;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003dcfcc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dcfb0:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dcfcc:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ce,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003dcd02;
    bVar3 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dcfcc;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003dcfb0;
LAB_003dcd02:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003dd097;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003dcfb9:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dd097:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6cf,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003dcd50;
    bVar3 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar3) {
      pcVar8 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dd097;
    }
    bVar3 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003dcfb9;
LAB_003dcd50:
    bVar3 = true;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003dd000:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6d0,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003dd000;
  }
  if (numparam == 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003dd028:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6d1,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dd028;
  }
  dVar1 = param[2].field_0.f;
  damage = param[3].field_0.i;
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003dd078;
    }
    iVar5 = param[4].field_0.i;
LAB_003dcdcb:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd0b6:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d3,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar7 = param[5].field_0.i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003dd078:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d2,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003dcdcb;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd0b6;
    }
    iVar7 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar8 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003dd047;
      }
      goto LAB_003dcdeb;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd047:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6d4,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003dcdeb:
  iVar2 = param[6].field_0.i;
  obj = &self->target;
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar6 != (AActor *)0x0) {
    A_FaceTarget(self);
    bVar4 = AActor::CheckMeleeRange(self);
    if (bVar4) {
      iVar9 = 0x89;
      if (iVar7 != 0) {
        iVar9 = iVar7;
      }
      if (iVar5 != 0) {
        local_54.ID = iVar5;
        S_Sound(self,1,&local_54,1.0,1.0);
      }
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_50 = 0;
      local_58.Index = iVar9;
      iVar5 = P_DamageMobj(pAVar6,self,self,damage,&local_58,0,angle);
      if (iVar2 != 0) {
        if (0 < iVar5) {
          damage = iVar5;
        }
        pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
        P_TraceBleed(damage,pAVar6,self);
      }
    }
    else if (!bVar3) {
      dVar10 = AActor::GetBobOffset(self,0.0);
      dVar1 = dVar1 + dVar10 + -32.0;
      local_48.Z = (self->__Pos).Z + dVar1;
      (self->__Pos).Z = local_48.Z;
      local_48.Z = local_48.Z + 32.0;
      local_48.X = (self->__Pos).X;
      local_48.Y = (self->__Pos).Y;
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar6 = P_SpawnMissileXYZ(&local_48,self,pAVar6,type,false,(AActor *)0x0);
      (self->__Pos).Z = (self->__Pos).Z - dVar1;
      if (pAVar6 != (AActor *)0x0) {
        if (((pAVar6->flags2).Value & 0x40000000) != 0) {
          (pAVar6->tracer).field_0 = obj->field_0;
        }
        P_CheckMissileSpawn(pAVar6,self->radius);
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT		(spawnheight);
	PARAM_INT		(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange())
	{
		if (damagetype == NAME_None)
			damagetype = NAME_Melee;	// Melee is the default type
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (ti) 
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = spawnheight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, ti, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2 & MF2_SEEKERMISSILE)
			{
				missile->tracer = self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
	return 0;
}